

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

string * __thiscall
helics::NetworkCommsInterface::getAddress_abi_cxx11_(NetworkCommsInterface *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  allocator<char> *in_RSI;
  string *in_RDI;
  string *address;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  char in_stack_fffffffffffffeff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b1 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_69 [2];
  undefined1 local_11;
  
  _Var2 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base<int> *)
                     CONCAT17(in_stack_fffffffffffffeff,
                              CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  if ((_Var2 < 0) && (((byte)in_RSI[0x25b] & 1) == 0)) {
    std::__cxx11::string::string
              (in_stack_ffffffffffffff30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff28);
  }
  else {
    local_11 = 0;
    std::__cxx11::string::string(in_stack_ffffffffffffff00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffef0,in_stack_fffffffffffffee8), bVar1)) {
      in_stack_ffffffffffffff00 = local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_RSI);
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
      gmlc::networking::makePortAddress(in_stack_ffffffffffffff28,(int)((ulong)in_RSI >> 0x20));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      std::__cxx11::string::~string(in_stack_fffffffffffffef0);
      std::__cxx11::string::~string(in_stack_fffffffffffffef0);
      std::allocator<char>::~allocator((allocator<char> *)local_69);
    }
    else {
      in_stack_fffffffffffffeff =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (((bool)in_stack_fffffffffffffeff) ||
         (in_stack_fffffffffffffefe =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
         (bool)in_stack_fffffffffffffefe)) {
        this_00 = local_b1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28,in_RSI);
        std::__atomic_base::operator_cast_to_int
                  ((__atomic_base<int> *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
        gmlc::networking::makePortAddress(in_stack_ffffffffffffff28,(int)((ulong)in_RSI >> 0x20));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        std::__cxx11::string::~string(this_00);
        std::__cxx11::string::~string(this_00);
        std::allocator<char>::~allocator((allocator<char> *)local_b1);
      }
      else {
        std::__atomic_base::operator_cast_to_int
                  ((__atomic_base<int> *)
                   CONCAT17(in_stack_fffffffffffffeff,
                            CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
        gmlc::networking::makePortAddress(in_stack_ffffffffffffff28,(int)((ulong)in_RSI >> 0x20));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        std::__cxx11::string::~string(in_stack_fffffffffffffef0);
      }
    }
    if (((byte)in_RSI[0x41a] & 1) != 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_ffffffffffffff00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffeff,
                          CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    }
  }
  return in_RDI;
}

Assistant:

std::string NetworkCommsInterface::getAddress() const
{
    using gmlc::networking::makePortAddress;

    if ((PortNumber < 0) && (!serverMode)) {
        return name;
    }
    std::string address;
    if ((localTargetAddress == "tcp://*") || (localTargetAddress == "tcp://0.0.0.0")) {
        address = makePortAddress("tcp://127.0.0.1", PortNumber);
    } else if ((localTargetAddress == "*") || (localTargetAddress == "0.0.0.0")) {
        address = makePortAddress("127.0.0.1", PortNumber);
    } else {
        address = makePortAddress(localTargetAddress, PortNumber);
    }
    if (appendNameToAddress) {
        address.push_back('/');
        address.append(name);
    }
    return address;
}